

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

int bhitm(monst *mtmp,obj *otmp)

{
  char oclass;
  short otyp;
  permonst *ptr;
  boolean bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  obj *poVar5;
  char *pcVar6;
  char *force;
  char *pcVar7;
  int iVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  char nambuf [256];
  
  otyp = otmp->otyp;
  iVar8 = (int)otyp;
  ptr = mtmp->data;
  bVar10 = true;
  if (ptr->mlet == '\r') {
    bVar10 = mtmp->m_ap_type == '\0';
  }
  bVar9 = urole.malenum == 0x15f & (u.uhave._0_1_ & 0x10) >> 4;
  switch(otyp) {
  case 0x1be:
    iVar8 = flash_hits_mon(mtmp,otmp);
    if (iVar8 == 0) goto LAB_00278e8c;
    iVar8 = 0x1be;
LAB_00279338:
    discover_object(iVar8,'\x01','\x01');
    goto LAB_0027933f;
  case 0x1bf:
  case 0x1c0:
  case 0x1c1:
  case 0x1c2:
  case 0x1cf:
  case 0x1d0:
  case 0x1d1:
  case 0x1d2:
    goto switchD_00278b00_caseD_1bf;
  case 0x1c3:
  case 0x1cd:
    goto switchD_00278b00_caseD_1c3;
  case 0x1c4:
    pcVar6 = "wand";
LAB_00278f34:
    bVar1 = resists_magm(mtmp);
    if (bVar1 == '\0') {
      if ((u._1052_1_ & 1) == 0) {
        iVar2 = rnd(0x14);
        iVar4 = find_mac(mtmp);
        if (iVar4 + 10 <= iVar2) {
          miss(pcVar6,mtmp);
          goto LAB_00279338;
        }
      }
      iVar2 = dice(2,0xc);
      uVar3 = iVar2 << bVar9;
      if (otyp == 0x187) {
        iVar2 = spell_damage_bonus();
        uVar3 = uVar3 + iVar2;
      }
      pcVar7 = "!";
      if (uVar3 < 5) {
        pcVar7 = ".";
      }
      force = "?";
      if (-1 < (int)uVar3) {
        force = pcVar7;
      }
      hit(pcVar6,'\0',mtmp,force);
      resist(mtmp,otmp->oclass,uVar3,1);
      goto LAB_00279338;
    }
    shieldeff(mtmp->mx,mtmp->my);
    goto LAB_0027933f;
  case 0x1c5:
    bVar9 = mtmp->field_0x60;
    pcVar6 = Monnam(mtmp);
    strcpy(nambuf,pcVar6);
    mon_set_minvis(mtmp);
    if (((bVar9 & 2) == 0) && ((mtmp->field_0x60 & 2) != 0)) {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) ||
         (((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0 &&
           (((youmonst.data)->mflags1 & 0x1000000) == 0)) &&
          ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00278fd2;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00278fc9;
        }
        else {
LAB_00278fc9:
          if (ublindf == (obj *)0x0) goto LAB_00278e8c;
LAB_00278fd2:
          if (ublindf->oartifact != '\x1d') goto LAB_00278e8c;
        }
        if (((u.uprops[0x19].intrinsic & 0xf8ffffff) == 0) ||
           (iVar8 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar8))
        goto LAB_00278e8c;
      }
      pline("%s turns transparent!",nambuf);
      discover_object(0x1c5,'\x01','\x01');
    }
    goto LAB_00278e8c;
  case 0x1c6:
switchD_00278b00_caseD_1c6:
    iVar8 = resist(mtmp,otmp->oclass,0,0);
    bVar10 = true;
    if (iVar8 == 0) {
      mon_adjust_speed(mtmp,-1,otmp);
      m_dowear(level,mtmp,'\0');
      if ((((u._1052_1_ & 1) != 0) && (u.ustuck == mtmp)) &&
         (mtmp->data == mons + 0x9f || mtmp->data->mlet == '\x16')) {
        pcVar6 = mon_nam(mtmp);
        pline("You disrupt %s!",pcVar6);
        pline("A huge hole opens up...");
        expels(mtmp,mtmp->data,'\x01');
      }
    }
    break;
  case 0x1c7:
    iVar8 = resist(mtmp,otmp->oclass,0,0);
    bVar10 = true;
    if (iVar8 == 0) {
      mon_adjust_speed(mtmp,1,otmp);
      m_dowear(level,mtmp,'\0');
    }
    break;
  case 0x1c8:
switchD_00278b00_caseD_1c8:
    iVar8 = unturn_dead(mtmp);
    if ((mtmp->data->mflags2 & 2) == 0) {
      bVar10 = true;
      if (iVar8 == 0) {
        return 0;
      }
    }
    else {
      iVar8 = rnd(8);
      iVar8 = iVar8 << bVar9;
      if (otyp == 0x19d) {
        iVar2 = spell_damage_bonus();
        iVar8 = iVar8 + iVar2;
      }
      flags.bypasses = '\x01';
      bVar10 = false;
      iVar8 = resist(mtmp,otmp->oclass,iVar8,0);
      if (iVar8 == 0) {
        if (mtmp->mhp < 1) goto LAB_0027933f;
        bVar10 = false;
        monflee(mtmp,0,'\0','\x01');
      }
    }
    break;
  case 0x1c9:
    goto switchD_00278b00_caseD_1c9;
  case 0x1ca:
switchD_00278b00_caseD_1ca:
    cancel_monst(mtmp,otmp,'\x01','\x01','\0');
    goto LAB_00278e8c;
  case 0x1cb:
switchD_00278b00_caseD_1cb:
    bVar1 = u_teleport_mon(mtmp,'\x01');
    bVar10 = bVar1 != '\0';
    break;
  case 0x1cc:
switchD_00278b00_caseD_1cc:
    if (((u._1052_1_ & 1) == 0) || (u.ustuck != mtmp)) {
      poVar5 = which_armor(mtmp,0x100000);
      if (poVar5 == (obj *)0x0) {
        return 0;
      }
      mtmp->misc_worn_check = mtmp->misc_worn_check & ~poVar5->owornmask;
      update_mon_intrinsics(level,mtmp,poVar5,'\0','\0');
      poVar5->owornmask = 0;
      obj_extract_self(poVar5);
      place_object(poVar5,level,(int)mtmp->mx,(int)mtmp->my);
      newsym((int)mtmp->mx,(int)mtmp->my);
      return 0;
    }
    if ((ptr->mflags1 & 0x40000) == 0) goto LAB_00279696;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00278c4a;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00278c45;
LAB_0027967d:
      pcVar6 = Monnam(mtmp);
      pline("%s opens its mouth!",pcVar6);
    }
    else {
LAB_00278c45:
      if (ublindf != (obj *)0x0) {
LAB_00278c4a:
        if (ublindf->oartifact == '\x1d') goto LAB_0027967d;
      }
      pline("You feel a sudden rush of air!");
    }
LAB_00279696:
    expels(mtmp,mtmp->data,'\x01');
    return 0;
  case 0x1ce:
    probe_monster(mtmp);
    discover_object(0x1ce,'\x01','\x01');
    goto LAB_0027938c;
  case 0x1d3:
    iVar8 = dice(otmp->spe + 1,0xc);
    iVar8 = sleep_monst(mtmp,iVar8,0xb);
    if (iVar8 != 0) {
      slept_monst(mtmp);
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00279073;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027906a;
LAB_0027931e:
      iVar8 = 0x1d3;
      goto LAB_00279338;
    }
LAB_0027906a:
    if (ublindf != (obj *)0x0) {
LAB_00279073:
      if (ublindf->oartifact == '\x1d') goto LAB_0027931e;
    }
LAB_0027933f:
    bVar10 = false;
    break;
  default:
    switch(otyp) {
    case 0x185:
switchD_00278b4e_caseD_196:
      if (ptr == mons + 0x145) {
        oclass = otmp->oclass;
        iVar8 = dice(3,(uint)(otyp == 0x196) * 4 + 4);
        resist(mtmp,oclass,iVar8,1);
        goto LAB_0027933f;
      }
      iVar8 = dice(6,(uint)(otyp == 0x196) * 4 + 4);
      iVar8 = iVar8 + mtmp->mhp;
      if (mtmp->mhpmax <= iVar8) {
        iVar8 = mtmp->mhpmax;
      }
      mtmp->mhp = iVar8;
      if (mtmp->mblinded != '\0') {
        mtmp->mblinded = '\0';
        mtmp->field_0x62 = mtmp->field_0x62 | 2;
      }
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002797f6;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00279265;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027925c;
        }
        else {
LAB_0027925c:
          if (ublindf == (obj *)0x0) goto LAB_00279891;
LAB_00279265:
          if (ublindf->oartifact != '\x1d') goto LAB_00279891;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
        goto LAB_002797f6;
      }
      else {
        bVar1 = worm_known(level,mtmp);
        if (bVar1 != '\0') {
LAB_002797f6:
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar3 & 0x280) == 0) goto LAB_00279834;
          }
          else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00279834:
            if ((u._1052_1_ & 0x20) == 0) {
              if (bVar10) {
                pcVar6 = Monnam(mtmp);
                pcVar7 = "";
                if (otyp == 0x196) {
                  pcVar7 = " much";
                }
                pline("%s looks%s better.",pcVar6,pcVar7);
              }
              else if ((mtmp->m_ap_type == '\x02') && (mtmp->mappearance == 0)) {
                set_mimic_sym(mtmp,level);
                newsym((int)mtmp->mx,(int)mtmp->my);
              }
              else {
                mimic_hit_msg(mtmp,otyp);
              }
            }
          }
        }
      }
LAB_00279891:
      if ((mtmp->mtame != '\0') || ((mtmp->field_0x62 & 0x40) != 0)) {
        if (urole.malenum == 0x15e) {
          iVar8 = 1;
        }
        else {
          iVar8 = sgn((int)u.ualign.type);
        }
        adjalign(iVar8);
      }
      goto LAB_0027938c;
    case 0x186:
      goto switchD_00278b00_caseD_1cc;
    case 0x187:
      pcVar6 = "spell";
      goto LAB_00278f34;
    case 0x188:
    case 0x189:
      break;
    case 0x18a:
      iVar8 = rnd(8);
      iVar2 = spell_damage_bonus();
      bVar1 = resists_drli(mtmp);
      if (bVar1 != '\0') {
LAB_00278e7f:
        shieldeff(mtmp->mx,mtmp->my);
        goto LAB_00278e8c;
      }
      iVar2 = (iVar8 << bVar9) + iVar2;
      iVar8 = resist(mtmp,otmp->oclass,iVar2,0);
      bVar10 = true;
      if ((iVar8 != 0) || (iVar8 = mtmp->mhp, iVar8 < 1)) goto LAB_00279342;
      iVar4 = mtmp->mhpmax - iVar2;
      mtmp->mhp = iVar8 - iVar2;
      mtmp->mhpmax = iVar4;
      if ((0 < iVar4 && (iVar8 - iVar2 != 0 && iVar2 <= iVar8)) && (mtmp->m_lev != '\0')) {
        mtmp->m_lev = mtmp->m_lev + 0xff;
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00279cd2;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00279cc9;
            }
            else {
LAB_00279cc9:
              if (ublindf == (obj *)0x0) goto LAB_00279342;
LAB_00279cd2:
              if (ublindf->oartifact != '\x1d') goto LAB_00279342;
            }
            if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                (((youmonst.data)->mflags3 & 0x100) == 0)) ||
               ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) goto LAB_00279342;
            bVar11 = (mtmp->data->mflags3 & 0x200) == 0;
            goto LAB_002792e9;
          }
        }
        else {
          bVar1 = worm_known(level,mtmp);
          bVar11 = bVar1 == '\0';
LAB_002792e9:
          if (bVar11) goto LAB_00279342;
        }
        uVar3 = *(uint *)&mtmp->field_0x60;
        if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar3 & 0x280) == 0) goto LAB_00279f2d;
        }
        else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00279f2d:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar6 = Monnam(mtmp);
            pcVar7 = "%s suddenly seems weaker!";
            goto LAB_00279c80;
          }
        }
        goto LAB_00279342;
      }
      iVar8 = 1;
LAB_0027a02b:
      bVar10 = true;
      xkilled(mtmp,iVar8);
      goto LAB_00279342;
    case 0x18b:
      goto switchD_00278b00_caseD_1c6;
    case 0x18c:
      goto switchD_00278b00_caseD_1c3;
    default:
      switch(otyp) {
      case 0x196:
        goto switchD_00278b4e_caseD_196;
      case 0x197:
      case 0x198:
      case 0x199:
      case 0x19a:
      case 0x19b:
      case 0x19c:
      case 0x1a0:
      case 0x1a2:
      case 0x1a3:
        break;
      case 0x19d:
        goto switchD_00278b00_caseD_1c8;
      case 0x19e:
switchD_00278b00_caseD_1c9:
        bVar1 = resists_magm(mtmp);
        if (bVar1 != '\0') goto LAB_00278e7f;
        iVar2 = resist(mtmp,otmp->oclass,0,0);
        bVar10 = true;
        if (iVar2 != 0) goto LAB_00279342;
        if (((mtmp->field_0x60 & 0x70) == 0) && (uVar3 = mt_random(), uVar3 % 0x19 == 0)) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00279fa9;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00279b67;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00279b5e;
            }
            else {
LAB_00279b5e:
              if (ublindf == (obj *)0x0) goto LAB_0027a013;
LAB_00279b67:
              if (ublindf->oartifact != '\x1d') goto LAB_0027a013;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0)
               ) goto LAB_00279fa9;
          }
          else {
            bVar1 = worm_known(level,mtmp);
            if (bVar1 != '\0') {
LAB_00279fa9:
              uVar3 = *(uint *)&mtmp->field_0x60;
              if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar3 & 0x280) == 0) goto LAB_00279fe5;
              }
              else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00279fe5:
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar6 = Monnam(mtmp);
                  pline("%s shudders!",pcVar6);
                  discover_object(iVar8,'\x01','\x01');
                }
              }
            }
          }
LAB_0027a013:
          poVar5 = (obj *)&mtmp->minvent;
          while (poVar5 = poVar5->nobj, poVar5 != (obj *)0x0) {
            bypass_obj(poVar5);
          }
          iVar8 = 3;
          goto LAB_0027a02b;
        }
        iVar2 = newcham(level,mtmp,(permonst *)0x0,otyp != 0x13a,'\0');
        if ((iVar2 == 0) ||
           (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
            ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0'))))))
        goto LAB_00279342;
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00279d8a;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00279a26;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00279a1d;
          }
          else {
LAB_00279a1d:
            if (ublindf == (obj *)0x0) goto LAB_00279dd9;
LAB_00279a26:
            if (ublindf->oartifact != '\x1d') goto LAB_00279dd9;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
          goto LAB_00279d8a;
LAB_00279dd9:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
              (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00279e27;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00279e22;
            }
            else {
LAB_00279e22:
              if (ublindf != (obj *)0x0) {
LAB_00279e27:
                if (ublindf->oartifact == '\x1d') goto LAB_00279eb9;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_00279f12;
            }
LAB_00279eb9:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar2 < 0x41))))
            goto LAB_00279f12;
          }
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0'))))
          goto LAB_00279342;
        }
        else {
          bVar1 = worm_known(level,mtmp);
          if (bVar1 == '\0') goto LAB_00279dd9;
LAB_00279d8a:
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_00279dca;
            goto LAB_00279dd9;
          }
          if ((uVar3 & 0x280) != 0) goto LAB_00279dd9;
LAB_00279dca:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_00279dd9;
        }
LAB_00279f12:
        discover_object(iVar8,'\x01','\x01');
        goto LAB_00279342;
      case 0x19f:
        goto switchD_00278b00_caseD_1cb;
      case 0x1a1:
        goto switchD_00278b00_caseD_1ca;
      case 0x1a4:
        iVar8 = monsndx(ptr);
        if (iVar8 != 0x108) {
          return 0;
        }
        pcVar6 = Monnam(mtmp);
        iVar8 = newcham(level,mtmp,mons + 0x106,'\0','\0');
        if (iVar8 == 0) {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027991a;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00279911;
              }
              else {
LAB_00279911:
                if (ublindf == (obj *)0x0) goto LAB_00278e8c;
LAB_0027991a:
                bVar10 = true;
                if (ublindf->oartifact != '\x1d') goto LAB_00279342;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (bVar10 = true, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  (bVar10 = true, (viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) ||
                 ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_00279342;
            }
          }
          else {
            bVar1 = worm_known(level,mtmp);
            if (bVar1 == '\0') goto LAB_00278e8c;
          }
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            bVar10 = true;
            if ((uVar3 & 0x280) == 0) goto LAB_00279c5f;
          }
          else {
            bVar10 = true;
            if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00279c5f:
              bVar10 = true;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar7 = "%s looks rather fleshy for a moment.";
                goto LAB_00279c80;
              }
            }
          }
        }
        else {
          if (mtmp->wormno == '\0') {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027977e;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00279775;
              }
              else {
LAB_00279775:
                if (ublindf == (obj *)0x0) goto LAB_00278e8c;
LAB_0027977e:
                bVar10 = true;
                if (ublindf->oartifact != '\x1d') goto LAB_00279342;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (bVar10 = true, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  (bVar10 = true, (viz_array[mtmp->my][mtmp->mx] & 1U) == 0)) ||
                 ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_00279342;
            }
          }
          else {
            bVar1 = worm_known(level,mtmp);
            if (bVar1 == '\0') goto LAB_00278e8c;
          }
          uVar3 = *(uint *)&mtmp->field_0x60;
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            bVar10 = true;
            if ((uVar3 & 0x280) == 0) goto LAB_00279afa;
          }
          else {
            bVar10 = true;
            if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00279afa:
              bVar10 = true;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar7 = "%s turns to flesh!";
LAB_00279c80:
                bVar10 = true;
                pline(pcVar7,pcVar6);
              }
            }
          }
        }
        goto LAB_00279342;
      default:
        if (otyp == 0x13a) goto switchD_00278b00_caseD_1c9;
      }
    }
    goto switchD_00278b00_caseD_1bf;
  }
LAB_00279342:
  if (mtmp->mhp < 1) {
    if (mtmp->m_ap_type != '\0') {
      seemimic(mtmp);
    }
  }
  else {
    wakeup(mtmp);
    m_respond(mtmp);
    if (((mtmp->field_0x63 & 2) != 0) && (u.ushops[0] == '\0')) {
      hot_pursuit(mtmp);
    }
  }
  if (bVar10) {
    return 0;
  }
LAB_0027938c:
  if (mtmp->mhp < 1) {
    return 0;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00279481;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027941f;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00279416;
    }
    else {
LAB_00279416:
      if (ublindf == (obj *)0x0) goto LAB_002794d8;
LAB_0027941f:
      if (ublindf->oartifact != '\x1d') goto LAB_002794d8;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_00279481;
  }
  else {
    bVar1 = worm_known(level,mtmp);
    if (bVar1 != '\0') {
LAB_00279481:
      uVar3 = *(uint *)&mtmp->field_0x60;
      if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar3 & 0x280) == 0) goto LAB_002794c4;
      }
      else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002794c4:
        if ((u._1052_1_ & 0x20) == 0) {
          return 0;
        }
      }
    }
  }
LAB_002794d8:
  if (((mtmp->data->mflags1 & 0x10000) == 0) &&
     ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
      (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00279530;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027952b;
    }
    else {
LAB_0027952b:
      if (ublindf != (obj *)0x0) {
LAB_00279530:
        if (ublindf->oartifact == '\x1d') goto LAB_002795d2;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
        return 0;
      }
    }
LAB_002795d2:
    if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
       (iVar8 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar8 < 0x41)) {
      return 0;
    }
  }
  if (((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) &&
     (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0')) {
    map_invisible(bhitpos.x,bhitpos.y);
  }
switchD_00278b00_caseD_1c3:
  return 0;
switchD_00278b00_caseD_1bf:
  warning("What an interesting effect (%d)");
LAB_00278e8c:
  bVar10 = true;
  goto LAB_00279342;
}

Assistant:

int bhitm(struct monst *mtmp, struct obj *otmp)
{
	boolean wake = TRUE;	/* Most 'zaps' should wake monster */
	boolean reveal_invis = FALSE;
	boolean dbldam = Role_if (PM_KNIGHT) && u.uhave.questart;
	int dmg, otyp = otmp->otyp;
	const char *zap_type_text = "spell";
	struct obj *obj;
	boolean disguised_mimic = (mtmp->data->mlet == S_MIMIC &&
				   mtmp->m_ap_type != M_AP_NOTHING);

	if (u.uswallow && mtmp == u.ustuck)
	    reveal_invis = FALSE;

	switch(otyp) {
	case WAN_STRIKING:
		zap_type_text = "wand";
		/* fall through */
	case SPE_FORCE_BOLT:
		reveal_invis = TRUE;
		if (resists_magm(mtmp)) {	/* match effect on player */
			shieldeff(mtmp->mx, mtmp->my);
			break;	/* skip makeknown */
		} else if (u.uswallow || rnd(20) < 10 + find_mac(mtmp)) {
			dmg = dice(2,12);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_FORCE_BOLT)
			    dmg += spell_damage_bonus();
			hit(zap_type_text, FALSE, mtmp, exclam(dmg));
			resist(mtmp, otmp->oclass, dmg, TELL);
		} else miss(zap_type_text, mtmp);
		makeknown(otyp);
		break;
	case WAN_SLOW_MONSTER:
	case SPE_SLOW_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, -1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
			if (u.uswallow && (mtmp == u.ustuck) &&
			    is_whirly(mtmp->data)) {
				pline("You disrupt %s!", mon_nam(mtmp));
				pline("A huge hole opens up...");
				expels(mtmp, mtmp->data, TRUE);
			}
		}
		break;
	case WAN_SPEED_MONSTER:
		if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
			mon_adjust_speed(mtmp, 1, otmp);
			m_dowear(level, mtmp, FALSE); /* might want speed boots */
		}
		break;
	case WAN_UNDEAD_TURNING:
	case SPE_TURN_UNDEAD:
		wake = FALSE;
		if (unturn_dead(mtmp)) wake = TRUE;
		if (is_undead(mtmp->data)) {
			reveal_invis = TRUE;
			wake = TRUE;
			dmg = rnd(8);
			if (dbldam) dmg *= 2;
			if (otyp == SPE_TURN_UNDEAD)
				dmg += spell_damage_bonus();
			flags.bypasses = TRUE;	/* for make_corpse() */
			if (!resist(mtmp, otmp->oclass, dmg, NOTELL)) {
			    if (mtmp->mhp > 0) monflee(mtmp, 0, FALSE, TRUE);
			}
		}
		break;
	case WAN_POLYMORPH:
	case SPE_POLYMORPH:
	case POT_POLYMORPH:
		if (resists_magm(mtmp)) {
		    /* magic resistance protects from polymorph traps, so make
		       it guard against involuntary polymorph attacks too... */
		    shieldeff(mtmp->mx, mtmp->my);
		} else if (!resist(mtmp, otmp->oclass, 0, NOTELL)) {
		    /* natural shapechangers aren't affected by system shock
		       (unless protection from shapechangers is interfering
		       with their metabolism...) */
		    if (mtmp->cham == CHAM_ORDINARY && !rn2(25)) {
			if (canseemon(level, mtmp)) {
			    pline("%s shudders!", Monnam(mtmp));
			    makeknown(otyp);
			}
			/* dropped inventory shouldn't be hit by this zap */
			for (obj = mtmp->minvent; obj; obj = obj->nobj)
			    bypass_obj(obj);
			/* flags.bypasses = TRUE; ## for make_corpse() */
			/* no corpse after system shock */
			xkilled(mtmp, 3);
		    } else if (newcham(level, mtmp, NULL,
				       (otyp != POT_POLYMORPH), FALSE)) {
			if (!Hallucination && canspotmon(level, mtmp))
			    makeknown(otyp);
		    }
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, TRUE, TRUE, FALSE);
		break;
	case WAN_TELEPORTATION:
	case SPE_TELEPORT_AWAY:
		reveal_invis = !u_teleport_mon(mtmp, TRUE);
		break;
	case WAN_MAKE_INVISIBLE:
	    {
		int oldinvis = mtmp->minvis;
		char nambuf[BUFSZ];

		/* format monster's name before altering its visibility */
		strcpy(nambuf, Monnam(mtmp));
		mon_set_minvis(mtmp);
		if (!oldinvis && knowninvisible(mtmp)) {
		    pline("%s turns transparent!", nambuf);
		    makeknown(otyp);
		}
		break;
	    }
	case WAN_NOTHING:
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
		wake = FALSE;
		break;
	case WAN_PROBING:
		wake = FALSE;
		reveal_invis = TRUE;
		probe_monster(mtmp);
		makeknown(otyp);
		break;
	case WAN_OPENING:
	case SPE_KNOCK:
		wake = FALSE;	/* don't want immediate counterattack */
		if (u.uswallow && mtmp == u.ustuck) {
			if (is_animal(mtmp->data)) {
				if (Blind) pline("You feel a sudden rush of air!");
				else pline("%s opens its mouth!", Monnam(mtmp));
			}
			expels(mtmp, mtmp->data, TRUE);
		} else if (!!(obj = which_armor(mtmp, W_SADDLE))) {
			mtmp->misc_worn_check &= ~obj->owornmask;
			update_mon_intrinsics(level, mtmp, obj, FALSE, FALSE);
			obj->owornmask = 0L;
			obj_extract_self(obj);
			place_object(obj, level, mtmp->mx, mtmp->my);
			/* call stackobj() if we ever drop anything that can merge */
			newsym(mtmp->mx, mtmp->my);
		}
		break;
	case SPE_HEALING:
	case SPE_EXTRA_HEALING:
		reveal_invis = TRUE;
	    if (mtmp->data != &mons[PM_PESTILENCE]) {
		wake = FALSE;		/* wakeup() makes the target angry */
		mtmp->mhp += dice(6, otyp == SPE_EXTRA_HEALING ? 8 : 4);
		if (mtmp->mhp > mtmp->mhpmax)
		    mtmp->mhp = mtmp->mhpmax;
		if (mtmp->mblinded) {
		    mtmp->mblinded = 0;
		    mtmp->mcansee = 1;
		}
		if (canseemon(level, mtmp)) {
		    if (disguised_mimic) {
			if (mtmp->m_ap_type == M_AP_OBJECT &&
			    mtmp->mappearance == STRANGE_OBJECT) {
			    /* it can do better now */
			    set_mimic_sym(mtmp, level);
			    newsym(mtmp->mx, mtmp->my);
			} else
			    mimic_hit_msg(mtmp, otyp);
		    } else pline("%s looks%s better.", Monnam(mtmp),
				 otyp == SPE_EXTRA_HEALING ? " much" : "" );
		}
		if (mtmp->mtame || mtmp->mpeaceful) {
		    adjalign(Role_if (PM_HEALER) ? 1 : sgn(u.ualign.type));
		}
	    } else {	/* Pestilence */
		/* Pestilence will always resist; damage is half of 3d{4,8} */
		resist(mtmp, otmp->oclass,
			      dice(3, otyp == SPE_EXTRA_HEALING ? 8 : 4), TELL);
	    }
		break;
	case WAN_LIGHT:	/* (broken wand) */
		if (flash_hits_mon(mtmp, otmp)) {
		    makeknown(WAN_LIGHT);
		    reveal_invis = TRUE;
		}
		break;
	case WAN_SLEEP:	/* (broken wand) */
		/* [wakeup() doesn't rouse victims of temporary sleep,
		    so it's okay to leave `wake' set to TRUE here] */
		reveal_invis = TRUE;
		if (sleep_monst(mtmp, dice(1 + otmp->spe, 12), WAND_CLASS))
		    slept_monst(mtmp);
		if (!Blind) makeknown(WAN_SLEEP);
		break;
	case SPE_STONE_TO_FLESH:
		if (monsndx(mtmp->data) == PM_STONE_GOLEM) {
		    char *name = Monnam(mtmp);
		    /* turn into flesh golem */
		    if (newcham(level, mtmp, &mons[PM_FLESH_GOLEM], FALSE, FALSE)) {
			if (canseemon(level, mtmp))
			    pline("%s turns to flesh!", name);
		    } else {
			if (canseemon(level, mtmp))
			    pline("%s looks rather fleshy for a moment.",
				  name);
		    }
		} else
		    wake = FALSE;
		break;
	case SPE_DRAIN_LIFE:
		dmg = rnd(8);
		if (dbldam) dmg *= 2;
		if (otyp == SPE_DRAIN_LIFE)
			dmg += spell_damage_bonus();
		if (resists_drli(mtmp))
		    shieldeff(mtmp->mx, mtmp->my);
		else if (!resist(mtmp, otmp->oclass, dmg, NOTELL) &&
				mtmp->mhp > 0) {
		    mtmp->mhp -= dmg;
		    mtmp->mhpmax -= dmg;
		    if (mtmp->mhp <= 0 || mtmp->mhpmax <= 0 || mtmp->m_lev < 1)
			xkilled(mtmp, 1);
		    else {
			mtmp->m_lev--;
			if (canseemon(level, mtmp))
			    pline("%s suddenly seems weaker!", Monnam(mtmp));
		    }
		}
		break;
	default:
		warning("What an interesting effect (%d)", otyp);
		break;
	}
	if (wake) {
	    if (mtmp->mhp > 0) {
		wakeup(mtmp);
		m_respond(mtmp);
		if (mtmp->isshk && !*u.ushops) hot_pursuit(mtmp);
	    } else if (mtmp->m_ap_type)
		seemimic(mtmp); /* might unblock if mimicing a boulder/door */
	}
	/* note: bhitpos won't be set if swallowed, but that's okay since
	 * reveal_invis will be false.  We can't use mtmp->mx, my since it
	 * might be an invisible worm hit on the tail.
	 */
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x, bhitpos.y) &&
							!canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}